

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSuite_Internals.cpp
# Opt level: O0

void __thiscall
psy::C::InternalsTestSuite::reparse
          (InternalsTestSuite *this,string *source,DisambiguationStrategy strategy,Expectation *X)

{
  ParseOptions parseOptions;
  byte bVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  void *pvVar5;
  undefined8 uVar6;
  pointer pSVar7;
  SyntaxNode *pSVar8;
  ulong uVar9;
  reference pSVar10;
  SyntaxKind kind;
  byte local_722;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6b8;
  undefined8 local_6b0;
  char *local_6a8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_6a0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_698;
  undefined8 local_690;
  undefined1 local_688 [8];
  string namesP;
  iterator iStack_640;
  SyntaxKind k;
  iterator __end1;
  iterator __begin1;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *__range1;
  string names;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_600;
  undefined8 local_5f8;
  char *local_5f0;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_5e0;
  undefined8 local_5d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5b0;
  undefined8 local_590;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_588;
  undefined8 local_580;
  char *local_578;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_570;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_568;
  undefined8 local_560;
  undefined8 local_558;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_550;
  undefined8 local_548;
  char *local_540;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_538;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_530;
  undefined8 local_528;
  undefined1 local_520 [8];
  string textP;
  Unparser unparser;
  ostringstream ossText;
  undefined1 local_370 [8];
  SyntaxNamePrinter printer;
  ostringstream ossTree;
  Expectation local_1c8;
  allocator<char> local_109;
  string local_108 [32];
  undefined1 local_e8 [16];
  anon_union_8_2_2d0bec1f_for_MacroTranslations_0 local_d8;
  anon_union_8_2_2d0bec1f_for_LanguageExtensions_1 aStack_d0;
  string local_c0 [32];
  SourceText local_a0;
  undefined1 local_80 [19];
  TextCompleteness textCompleness;
  undefined1 auStack_68 [8];
  ParseOptions parseOpts;
  string text;
  Expectation *X_local;
  DisambiguationStrategy strategy_local;
  string *source_local;
  InternalsTestSuite *this_local;
  
  std::__cxx11::string::string((string *)&parseOpts.field_2.BF_,(string *)source);
  ParseOptions::ParseOptions((ParseOptions *)auStack_68);
  if (strategy == TypeSynonymsVerification) {
    ParseOptions::setAmbiguityMode((ParseOptions *)auStack_68,DisambiguateAlgorithmically);
    local_80[0xb] = 1;
  }
  else if (strategy == SyntaxCorrelation) {
    ParseOptions::setAmbiguityMode((ParseOptions *)auStack_68,DisambiguateAlgorithmically);
    local_80[0xb] = 2;
  }
  else {
    if (strategy != GuidelineImposition) {
      poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
      poVar4 = std::operator<<(poVar4,"\tReason: ");
      poVar4 = std::operator<<(poVar4,"unknown strategy");
      poVar4 = std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<(poVar4,"\t\t");
      poVar4 = std::operator<<(poVar4,
                               "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                              );
      poVar4 = std::operator<<(poVar4,":");
      pvVar5 = (void *)std::ostream::operator<<(poVar4,0x138);
      std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
      uVar6 = __cxa_allocate_exception(1);
      __cxa_throw(uVar6,&TestFailed::typeinfo,0);
    }
    ParseOptions::setAmbiguityMode((ParseOptions *)auStack_68,DisambiguateHeuristically);
    local_80[0xb] = 0;
  }
  std::__cxx11::string::string(local_c0,(string *)&parseOpts.field_2.BF_);
  psy::SourceText::SourceText(&local_a0,local_c0);
  bVar1 = local_80[0xb];
  local_d8 = parseOpts.langExts_.translations_.field_0;
  aStack_d0 = parseOpts.langExts_.field_1;
  local_e8._0_8_ = auStack_68;
  local_e8._8_8_ = parseOpts._0_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_108,"",&local_109);
  parseOptions.langExts_.translations_.field_0 =
       (anon_union_8_2_2d0bec1f_for_MacroTranslations_0)local_e8._8_8_;
  parseOptions._0_8_ = local_e8._0_8_;
  parseOptions.langExts_.field_1.BF_all_ = local_d8.BF_all_;
  parseOptions._24_8_ = aStack_d0.BF_all_;
  SyntaxTree::parseText
            ((SourceText *)local_80,(TextPreprocessingState)&local_a0,Unknown,parseOptions,
             (string *)(ulong)bVar1,(SyntaxCategory)local_108);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::operator=
            (&this->tree_,
             (unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)local_80);
  std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_> *)local_80);
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator(&local_109);
  SourceText::~SourceText(&local_a0);
  std::__cxx11::string::~string(local_c0);
  local_722 = 0;
  if ((X->containsAmbiguity_ & 1U) == 0) {
    Expectation::Expectation(&local_1c8,X);
    bVar2 = checkErrorAndWarn(this,&local_1c8);
    local_722 = bVar2 ^ 0xff;
    Expectation::~Expectation(&local_1c8);
  }
  if ((local_722 & 1) == 0) {
    std::__cxx11::ostringstream::ostringstream
              ((ostringstream *)
               &printer.dump_.
                super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    pSVar7 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::get
                       (&this->tree_);
    SyntaxNamePrinter::SyntaxDumper((SyntaxNamePrinter *)local_370,pSVar7);
    pSVar7 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::
             operator->(&this->tree_);
    pSVar8 = SyntaxTree::root(pSVar7);
    SyntaxNamePrinter::print
              ((SyntaxNamePrinter *)local_370,pSVar8,Plain,
               (ostream *)
               &printer.dump_.
                super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&unparser.os_);
    pSVar7 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::get
                       (&this->tree_);
    Unparser::SyntaxDumper((Unparser *)((long)&textP.field_2 + 8),pSVar7);
    pSVar7 = std::unique_ptr<psy::C::SyntaxTree,_std::default_delete<psy::C::SyntaxTree>_>::
             operator->(&this->tree_);
    pSVar8 = SyntaxTree::root(pSVar7);
    Unparser::unparse((Unparser *)((long)&textP.field_2 + 8),pSVar8,(ostream *)&unparser.os_);
    std::__cxx11::ostringstream::str();
    local_538._M_current = (char *)std::__cxx11::string::begin();
    local_540 = (char *)std::__cxx11::string::end();
    local_530 = std::
                remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                          (local_538,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_540,isspace);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_528,&local_530);
    local_550._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_548,&local_550);
    local_558 = std::__cxx11::string::erase(local_520,local_528,local_548);
    local_570._M_current = (char *)std::__cxx11::string::begin();
    local_578 = (char *)std::__cxx11::string::end();
    local_568 = std::
                remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                          (local_570,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )local_578,isspace);
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_560,&local_568);
    local_588._M_current = (char *)std::__cxx11::string::end();
    __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
              ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_580,&local_588);
    local_590 = std::__cxx11::string::erase(&parseOpts.field_2,local_560,local_580);
    if ((X->containsAmbiguity_ & 1U) == 0) {
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_520,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &parseOpts.field_2.BF_);
      if (!_Var3) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar4 = std::operator<<(poVar4,"\t\tActual  : ");
        poVar4 = std::operator<<(poVar4,(string *)local_520);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"\t\tExpected: ");
        poVar4 = std::operator<<(poVar4,(string *)&parseOpts.field_2.BF_);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"\t\t");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,0x167);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&TestFailed::typeinfo,0);
      }
    }
    else {
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        local_5e8._M_current = (char *)std::__cxx11::string::begin();
        local_5f0 = (char *)std::__cxx11::string::end();
        local_5e0 = std::
                    remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                              (local_5e8,
                               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )local_5f0,isspace);
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_5d8,&local_5e0);
        local_600._M_current = (char *)std::__cxx11::string::end();
        __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                  ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_5f8,&local_600);
        names.field_2._8_8_ = std::__cxx11::string::erase(&X->ambiguityText_,local_5d8,local_5f8);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_520,&X->ambiguityText_);
        if (!_Var3) {
          poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar4 = std::operator<<(poVar4,"\t\tActual  : ");
          poVar4 = std::operator<<(poVar4,(string *)local_520);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"\t\tExpected: ");
          poVar4 = std::operator<<(poVar4,(string *)&X->ambiguityText_);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"\t\t");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,0x163);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          uVar6 = __cxa_allocate_exception(1);
          __cxa_throw(uVar6,&TestFailed::typeinfo,0);
        }
      }
      else {
        std::operator+(&local_5b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parseOpts.field_2.BF_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &parseOpts.field_2.BF_);
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_520,&local_5b0);
        std::__cxx11::string::~string((string *)&local_5b0);
        if (((_Var3 ^ 0xffU) & 1) != 0) {
          poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
          poVar4 = std::operator<<(poVar4,"\t\tActual  : ");
          poVar4 = std::operator<<(poVar4,(string *)local_520);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"\t\tExpected: ");
          std::operator+(&local_5d0,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parseOpts.field_2.BF_,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &parseOpts.field_2.BF_);
          poVar4 = std::operator<<(poVar4,(string *)&local_5d0);
          poVar4 = std::operator<<(poVar4,"\n");
          poVar4 = std::operator<<(poVar4,"\t\t");
          poVar4 = std::operator<<(poVar4,
                                   "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                  );
          poVar4 = std::operator<<(poVar4,":");
          pvVar5 = (void *)std::ostream::operator<<(poVar4,0x15d);
          std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_5d0);
          uVar6 = __cxa_allocate_exception(1);
          __cxa_throw(uVar6,&TestFailed::typeinfo,0);
        }
      }
    }
    bVar2 = std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::empty
                      (&X->syntaxKinds_);
    if (!bVar2) {
      std::__cxx11::string::string((string *)&__range1);
      __end1 = std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::begin
                         (&X->syntaxKinds_);
      iStack_640 = std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::end
                             (&X->syntaxKinds_);
      while (bVar2 = __gnu_cxx::operator!=(&__end1,&stack0xfffffffffffff9c0), bVar2) {
        pSVar10 = __gnu_cxx::
                  __normal_iterator<psy::C::SyntaxKind_*,_std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>_>
                  ::operator*(&__end1);
        to_string_abi_cxx11_((string *)((long)&namesP.field_2 + 8),(C *)(ulong)*pSVar10,kind);
        std::__cxx11::string::operator+=
                  ((string *)&__range1,(string *)(namesP.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(namesP.field_2._M_local_buf + 8));
        __gnu_cxx::
        __normal_iterator<psy::C::SyntaxKind_*,_std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>_>
        ::operator++(&__end1);
      }
      std::__cxx11::ostringstream::str();
      local_6a0._M_current = (char *)std::__cxx11::string::begin();
      local_6a8 = (char *)std::__cxx11::string::end();
      local_698 = std::
                  remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)noexcept>
                            (local_6a0,
                             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              )local_6a8,isspace);
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_690,&local_698);
      local_6b8._M_current = (char *)std::__cxx11::string::end();
      __gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>::__normal_iterator<char*>
                ((__normal_iterator<char_const*,std::__cxx11::string> *)&local_6b0,&local_6b8);
      std::__cxx11::string::erase(local_688,local_690,local_6b0);
      _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_688,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &__range1);
      if (!_Var3) {
        poVar4 = std::operator<<((ostream *)&std::cout,"\n!\tFAIL\n");
        poVar4 = std::operator<<(poVar4,"\t\tActual  : ");
        poVar4 = std::operator<<(poVar4,(string *)local_688);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"\t\tExpected: ");
        poVar4 = std::operator<<(poVar4,(string *)&__range1);
        poVar4 = std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<(poVar4,"\t\t");
        poVar4 = std::operator<<(poVar4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/tests/TestSuite_Internals.cpp"
                                );
        poVar4 = std::operator<<(poVar4,":");
        pvVar5 = (void *)std::ostream::operator<<(poVar4,0x172);
        std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&TestFailed::typeinfo,0);
      }
      std::__cxx11::string::~string((string *)local_688);
      std::__cxx11::string::~string((string *)&__range1);
    }
    std::__cxx11::string::~string((string *)local_520);
    Unparser::~Unparser((Unparser *)((long)&textP.field_2 + 8));
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&unparser.os_);
    SyntaxNamePrinter::~SyntaxNamePrinter((SyntaxNamePrinter *)local_370);
    std::__cxx11::ostringstream::~ostringstream
              ((ostringstream *)
               &printer.dump_.
                super__Vector_base<std::tuple<const_psy::C::SyntaxNode_*,_int>,_std::allocator<std::tuple<const_psy::C::SyntaxNode_*,_int>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::__cxx11::string::~string((string *)&parseOpts.field_2.BF_);
  return;
}

Assistant:

void InternalsTestSuite::reparse(std::string source,
                                 Reparser::DisambiguationStrategy strategy,
                                 Expectation X)
{
    auto text = source;

    ParseOptions parseOpts;
    TextCompleteness textCompleness;
    switch (strategy) {
        case Reparser::DisambiguationStrategy::SyntaxCorrelation:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Fragment;
            break;

        case Reparser::DisambiguationStrategy::TypeSynonymsVerification:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateAlgorithmically);
            textCompleness = TextCompleteness::Full;
            break;

        case Reparser::DisambiguationStrategy::GuidelineImposition:
            parseOpts.setAmbiguityMode(
                        ParseOptions::AmbiguityMode::DisambiguateHeuristically);
            textCompleness = TextCompleteness::Unknown;
            break;

        default:
            PSY__internals__FAIL("unknown strategy");
    }

    tree_ = SyntaxTree::parseText(text,
                                  TextPreprocessingState::Unknown,
                                  textCompleness,
                                  parseOpts,
                                  "");

    if (!X.containsAmbiguity_ && !checkErrorAndWarn(X))
        return;

    std::ostringstream ossTree;
    SyntaxNamePrinter printer(tree_.get());
    printer.print(tree_->root(),
                  SyntaxNamePrinter::Style::Plain,
                  ossTree);

#ifdef DUMP_AST
    std::cout << "\n\n"
              << "========================== AST ==================================\n"
              << source << "\n"
              << "-----------------------------------------------------------------"
              << ossTree.str()
              << "=================================================================\n";
#endif

    std::ostringstream ossText;
    Unparser unparser(tree_.get());
    unparser.unparse(tree_->root(), ossText);

    std::string textP = ossText.str();
    textP.erase(std::remove_if(textP.begin(), textP.end(), ::isspace), textP.end());
    text.erase(std::remove_if(text.begin(), text.end(), ::isspace), text.end());

    if (X.containsAmbiguity_) {
        if (X.ambiguityText_.empty())
            PSY_EXPECT_EQ_STR(textP, text + text);
        else {
            X.ambiguityText_.erase(
                        std::remove_if(X.ambiguityText_.begin(),
                                       X.ambiguityText_.end(), ::isspace),
                        X.ambiguityText_.end());
            PSY_EXPECT_EQ_STR(textP, X.ambiguityText_);
        }
    }
    else
        PSY_EXPECT_EQ_STR(textP, text);

    if (X.syntaxKinds_.empty())
        return;

    std::string names;
    for (auto k : X.syntaxKinds_)
        names += to_string(k);

    std::string namesP = ossTree.str();
    namesP.erase(std::remove_if(namesP.begin(), namesP.end(), ::isspace), namesP.end());
    PSY_EXPECT_EQ_STR(namesP, names);
}